

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_WHILE(DisasContext_conflict1 *s,arg_WHILE *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr a_00;
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  uint32_t val;
  int iVar4;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  TCGv_i64 v1;
  TCGv_i32 ret_03;
  TCGv_i32 arg3;
  TCGv_ptr r;
  TCGCond local_94;
  ulong local_90;
  TCGCond cond;
  uint vsz;
  uint desc;
  TCGv_ptr ptr;
  TCGv_i32 t3;
  TCGv_i32 t2;
  TCGv_i64 tmax;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGv_i64 op1;
  TCGv_i64 op0;
  TCGContext_conflict1 *tcg_ctx;
  arg_WHILE *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = vec_full_reg_size(s);
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    ret = read_cpu_reg_aarch64(s,a->rn,1);
    ret_00 = read_cpu_reg_aarch64(s,a->rm,1);
    if (a->sf == 0) {
      if (a->u == 0) {
        tcg_gen_ext32s_i64_aarch64(tcg_ctx_00,ret,ret);
        tcg_gen_ext32s_i64_aarch64(tcg_ctx_00,ret_00,ret_00);
      }
      else {
        tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,ret,ret);
        tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,ret_00,ret_00);
      }
    }
    ret_01 = tcg_temp_new_i64(tcg_ctx_00);
    ret_02 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_sub_i64(tcg_ctx_00,ret_01,ret_00,ret);
    v1 = tcg_const_i64_aarch64(tcg_ctx_00,(ulong)(uVar2 >> ((byte)a->esz & 0x1f)));
    if (a->eq != 0) {
      tcg_gen_addi_i64_aarch64(tcg_ctx_00,ret_01,ret_01,1);
      if (a->sf == 0) {
        uVar3 = 0x7fffffff;
        if (a->u != 0) {
          uVar3 = 0xffffffff;
        }
        local_90 = (ulong)uVar3;
      }
      else {
        local_90 = 0x7fffffffffffffff;
        if (a->u != 0) {
          local_90 = 0xffffffffffffffff;
        }
      }
      tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret_02,local_90);
      tcg_gen_movcond_i64_aarch64(tcg_ctx_00,TCG_COND_EQ,ret_01,ret_00,ret_02,v1,ret_01);
    }
    tcg_gen_umin_i64_aarch64(tcg_ctx_00,ret_01,ret_01,v1);
    tcg_temp_free_i64(tcg_ctx_00,v1);
    if (a->u == 0) {
      local_94 = TCG_COND_LT;
      if (a->eq != 0) {
        local_94 = TCG_COND_LE;
      }
    }
    else {
      local_94 = TCG_COND_LTU;
      if (a->eq != 0) {
        local_94 = TCG_COND_LEU;
      }
    }
    tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret_02,0);
    tcg_gen_movcond_i64_aarch64(tcg_ctx_00,local_94,ret_01,ret,ret_00,ret_01,ret_02);
    tcg_temp_free_i64(tcg_ctx_00,ret_02);
    ret_03 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx_00,ret_03,ret_01);
    tcg_temp_free_i64(tcg_ctx_00,ret_01);
    tcg_gen_shli_i32_aarch64(tcg_ctx_00,ret_03,ret_03,a->esz);
    val = deposit32((uVar2 >> 3) - 2,10,2,a->esz);
    arg3 = tcg_const_i32_aarch64(tcg_ctx_00,val);
    r = tcg_temp_new_ptr(tcg_ctx_00);
    a_00 = tcg_ctx_00->cpu_env;
    iVar4 = pred_full_reg_offset(s,a->rd);
    tcg_gen_addi_ptr(tcg_ctx_00,r,a_00,(long)iVar4);
    gen_helper_sve_while(tcg_ctx_00,ret_03,r,ret_03,arg3);
    do_pred_flags(tcg_ctx_00,ret_03);
    tcg_temp_free_ptr(tcg_ctx_00,r);
    tcg_temp_free_i32(tcg_ctx_00,ret_03);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
  }
  return true;
}

Assistant:

static bool trans_WHILE(DisasContext *s, arg_WHILE *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 op0, op1, t0, t1, tmax;
    TCGv_i32 t2, t3;
    TCGv_ptr ptr;
    unsigned desc, vsz = vec_full_reg_size(s);
    TCGCond cond;

    if (!sve_access_check(s)) {
        return true;
    }

    op0 = read_cpu_reg(s, a->rn, 1);
    op1 = read_cpu_reg(s, a->rm, 1);

    if (!a->sf) {
        if (a->u) {
            tcg_gen_ext32u_i64(tcg_ctx, op0, op0);
            tcg_gen_ext32u_i64(tcg_ctx, op1, op1);
        } else {
            tcg_gen_ext32s_i64(tcg_ctx, op0, op0);
            tcg_gen_ext32s_i64(tcg_ctx, op1, op1);
        }
    }

    /* For the helper, compress the different conditions into a computation
     * of how many iterations for which the condition is true.
     */
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_sub_i64(tcg_ctx, t0, op1, op0);

    tmax = tcg_const_i64(tcg_ctx, vsz >> a->esz);
    if (a->eq) {
        /* Equality means one more iteration.  */
        tcg_gen_addi_i64(tcg_ctx, t0, t0, 1);

        /* If op1 is max (un)signed integer (and the only time the addition
         * above could overflow), then we produce an all-true predicate by
         * setting the count to the vector length.  This is because the
         * pseudocode is described as an increment + compare loop, and the
         * max integer would always compare true.
         */
        tcg_gen_movi_i64(tcg_ctx, t1, (a->sf
                              ? (a->u ? UINT64_MAX : INT64_MAX)
                              : (a->u ? UINT32_MAX : INT32_MAX)));
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, op1, t1, tmax, t0);
    }

    /* Bound to the maximum.  */
    tcg_gen_umin_i64(tcg_ctx, t0, t0, tmax);
    tcg_temp_free_i64(tcg_ctx, tmax);

    /* Set the count to zero if the condition is false.  */
    cond = (a->u
            ? (a->eq ? TCG_COND_LEU : TCG_COND_LTU)
            : (a->eq ? TCG_COND_LE : TCG_COND_LT));
    tcg_gen_movi_i64(tcg_ctx, t1, 0);
    tcg_gen_movcond_i64(tcg_ctx, cond, t0, op0, op1, t0, t1);
    tcg_temp_free_i64(tcg_ctx, t1);

    /* Since we're bounded, pass as a 32-bit type.  */
    t2 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, t2, t0);
    tcg_temp_free_i64(tcg_ctx, t0);

    /* Scale elements to bits.  */
    tcg_gen_shli_i32(tcg_ctx, t2, t2, a->esz);

    desc = (vsz / 8) - 2;
    desc = deposit32(desc, SIMD_DATA_SHIFT, 2, a->esz);
    t3 = tcg_const_i32(tcg_ctx, desc);

    ptr = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, ptr, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));

    gen_helper_sve_while(tcg_ctx, t2, ptr, t2, t3);
    do_pred_flags(tcg_ctx, t2);

    tcg_temp_free_ptr(tcg_ctx, ptr);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    return true;
}